

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

unique_ptr<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>_> __thiscall
cmMakefileTargetGenerator::CreateLinkLineComputer
          (cmMakefileTargetGenerator *this,cmOutputConverter *outputConverter,
          cmStateDirectory *stateDir)

{
  cmMakefile *this_00;
  bool bVar1;
  undefined8 in_RCX;
  allocator<char> local_49;
  string local_48;
  undefined8 local_28;
  cmStateDirectory *stateDir_local;
  cmOutputConverter *outputConverter_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (cmMakefile *)(outputConverter->StateSnapshot).Position.Position;
  local_28 = in_RCX;
  stateDir_local = stateDir;
  outputConverter_local = outputConverter;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"MSVC60",&local_49);
  bVar1 = cmMakefile::IsOn(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    cmGlobalGenerator::CreateMSVC60LinkLineComputer
              ((cmGlobalGenerator *)this,*(cmOutputConverter **)&outputConverter[1].LinkScriptShell,
               stateDir_local);
  }
  else {
    (**(code **)(**(long **)&outputConverter[1].LinkScriptShell + 0x80))
              (this,*(long **)&outputConverter[1].LinkScriptShell,stateDir_local,local_28);
  }
  return (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         (__uniq_ptr_data<cmLinkLineComputer,_std::default_delete<cmLinkLineComputer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<cmLinkLineComputer>
cmMakefileTargetGenerator::CreateLinkLineComputer(
  cmOutputConverter* outputConverter, cmStateDirectory const& stateDir)
{
  if (this->Makefile->IsOn("MSVC60")) {
    return this->GlobalGenerator->CreateMSVC60LinkLineComputer(outputConverter,
                                                               stateDir);
  }
  return this->GlobalGenerator->CreateLinkLineComputer(outputConverter,
                                                       stateDir);
}